

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall olc::Renderer_OGL10::SetDecalMode(Renderer_OGL10 *this,DecalMode *mode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if (*mode == this->nDecalMode) {
    return;
  }
  switch(*mode) {
  case NORMAL:
  case WIREFRAME:
    uVar2 = 0x302;
    break;
  case ADDITIVE:
    uVar1 = 1;
    uVar2 = 0x302;
    goto LAB_00125957;
  case MULTIPLICATIVE:
    uVar2 = 0x306;
    break;
  case STENCIL:
    uVar2 = 0;
    goto LAB_0012593c;
  case ILLUMINATE:
    uVar2 = 0x303;
LAB_0012593c:
    uVar1 = 0x302;
    goto LAB_00125957;
  default:
    goto switchD_0012592a_default;
  }
  uVar1 = 0x303;
LAB_00125957:
  glBlendFunc(uVar2,uVar1);
switchD_0012592a_default:
  this->nDecalMode = *mode;
  return;
}

Assistant:

void SetDecalMode(const olc::DecalMode &mode)
		{
			if (mode != nDecalMode)
			{
				switch (mode)
				{
				case olc::DecalMode::NORMAL:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::ADDITIVE:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE);
					break;
				case olc::DecalMode::MULTIPLICATIVE:
					glBlendFunc(GL_DST_COLOR, GL_ONE_MINUS_SRC_ALPHA);
					break;
				case olc::DecalMode::STENCIL:
					glBlendFunc(GL_ZERO, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::ILLUMINATE:
					glBlendFunc(GL_ONE_MINUS_SRC_ALPHA, GL_SRC_ALPHA);
					break;
				case olc::DecalMode::WIREFRAME:
					glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
					break;
				}

				nDecalMode = mode;
			}
		}